

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O2

void msr_get_context(raplcap_msr_ctx *ctx,uint32_t cpu_model,uint64_t units_msrval)

{
  uint uVar1;
  byte bVar2;
  double dVar3;
  raplcap_msr_zone_cfg *prVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x149,"void msr_get_context(raplcap_msr_ctx *, uint32_t, uint64_t)");
  }
  if (cpu_model == 0) {
    __assert_fail("cpu_model > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x14a,"void msr_get_context(raplcap_msr_ctx *, uint32_t, uint64_t)");
  }
  ctx->cpu_model = cpu_model;
  uVar5 = (uint)units_msrval;
  uVar1 = (uint)(units_msrval >> 8);
  bVar2 = (byte)units_msrval;
  switch(cpu_model) {
  case 0x2b:
  case 0x2c:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x48:
  case 0x49:
  case 0x4b:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x58:
  case 0x59:
  case 0x5b:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6b:
switchD_00103fe0_caseD_2b:
    fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap");
    fwrite("Unknown architecture\n",0x15,1,_stderr);
    fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap");
    fwrite("Please report a bug if you see this message, it should never occur!\n",0x44,1,_stderr);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x1d3,"void msr_get_context(raplcap_msr_ctx *, uint32_t, uint64_t)");
  case 0x37:
  case 0x4a:
  case 0x5a:
  case 0x5d:
    dVar3 = (double)(1L << ((byte)(units_msrval >> 8) & 0x1f)) / 1000000.0;
    ctx->power_units = (double)(1 << (bVar2 & 0xf)) / 1000.0;
    prVar4 = CFG_ATOM;
    dVar6 = dVar3;
    dVar7 = dVar3;
    break;
  case 0x3f:
  case 0x4f:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x6a:
  case 0x6c:
switchD_00103fe0_caseD_3f:
    ctx->power_units = (double)(((ulong)(uVar5 & 0xf) ^ 0x3ff) << 0x34);
    dVar3 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
    prVar4 = CFG_DEFAULT;
    dVar6 = 1.53e-05;
    dVar7 = dVar3;
    break;
  case 0x4c:
    ctx->power_units = (double)(1 << (bVar2 & 0xf)) / 1000.0;
    dVar3 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
    prVar4 = CFG_ATOM_AIRMONT;
    dVar6 = dVar3;
    dVar7 = dVar3;
    break;
  case 0x4d:
    ctx->power_units = (double)(1 << (bVar2 & 0xf)) / 1000.0;
    goto LAB_00104163;
  default:
    switch(cpu_model) {
    case 0x7a:
    case 0x7d:
    case 0x7e:
    case 0x86:
    case 0x8e:
      break;
    case 0x7b:
    case 0x7c:
    case 0x7f:
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
      goto switchD_00103fe0_caseD_2b;
    case 0x85:
      goto switchD_00103fe0_caseD_3f;
    case 0x8c:
    case 0x8d:
switchD_00104194_caseD_b7:
      ctx->power_units = (double)(((ulong)(uVar5 & 0xf) ^ 0x3ff) << 0x34);
      dVar3 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
      prVar4 = CFG_DEFAULT_PL4;
      dVar6 = dVar3;
      dVar7 = dVar3;
      goto LAB_001042e8;
    case 0x8f:
switchD_0010414e_caseD_8f:
      ctx->power_units = (double)(((ulong)(uVar5 & 0xf) ^ 0x3ff) << 0x34);
      dVar3 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
      prVar4 = CFG_SPR;
      dVar6 = 6.1e-05;
      dVar7 = 1.0;
      goto LAB_001042e8;
    default:
      switch(cpu_model) {
      case 0xb7:
      case 0xba:
      case 0xbf:
        goto switchD_00104194_caseD_b7;
      case 0xb8:
      case 0xb9:
      case 0xbb:
      case 0xbc:
      case 0xbe:
        goto switchD_00103fe0_caseD_2b;
      case 0xbd:
switchD_00104194_caseD_bd:
        ctx->power_units = (double)(((ulong)(uVar5 & 0xf) ^ 0x3ff) << 0x34);
        dVar3 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
        prVar4 = CFG_METEORLAKE;
        dVar6 = dVar3;
        dVar7 = dVar3;
        goto LAB_001042e8;
      default:
        if (((2 < cpu_model - 0xad) && (1 < cpu_model - 0xa5)) && (cpu_model != 0x96)) {
          if ((cpu_model == 0x97) || (cpu_model == 0x9a)) goto switchD_00104194_caseD_b7;
          if (cpu_model != 0x9c) {
            if (cpu_model == 0xcf) goto switchD_0010414e_caseD_8f;
            if (cpu_model == 0xaa) goto switchD_00104194_caseD_bd;
            if (cpu_model != 0x9e) goto switchD_00103fe0_caseD_2b;
          }
        }
      }
    }
  case 0x2a:
  case 0x2d:
  case 0x3a:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x4e:
  case 0x5c:
  case 0x5e:
  case 0x5f:
  case 0x66:
    ctx->power_units = (double)(((ulong)(uVar5 & 0xf) ^ 0x3ff) << 0x34);
LAB_00104163:
    dVar3 = (double)(((ulong)(uVar1 & 0x1f) ^ 0x3ff) << 0x34);
    prVar4 = CFG_DEFAULT;
    dVar6 = dVar3;
    dVar7 = dVar3;
  }
LAB_001042e8:
  ctx->energy_units = dVar3;
  ctx->energy_units_dram = dVar6;
  ctx->energy_units_psys = dVar7;
  ctx->time_units = (double)(((ulong)(uVar5 >> 0x10 & 0xf) ^ 0x3ff) << 0x34);
  ctx->cfg = prVar4;
  return;
}

Assistant:

void msr_get_context(raplcap_msr_ctx* ctx, uint32_t cpu_model, uint64_t units_msrval) {
  assert(ctx != NULL);
  assert(cpu_model > 0);
  ctx->cpu_model = cpu_model;
  switch (cpu_model) {
    case CPUID_MODEL_SANDYBRIDGE:
    case CPUID_MODEL_SANDYBRIDGE_X:
    //
    case CPUID_MODEL_IVYBRIDGE:
    case CPUID_MODEL_IVYBRIDGE_X:
    //
    case CPUID_MODEL_HASWELL:
    case CPUID_MODEL_HASWELL_L:
    case CPUID_MODEL_HASWELL_G:
    //
    case CPUID_MODEL_BROADWELL:
    case CPUID_MODEL_BROADWELL_G:
    //
    case CPUID_MODEL_SKYLAKE_L:
    case CPUID_MODEL_SKYLAKE:
    //
    case CPUID_MODEL_KABYLAKE_L:
    case CPUID_MODEL_KABYLAKE:
    //
    case CPUID_MODEL_CANNONLAKE_L:
    //
    case CPUID_MODEL_ICELAKE:
    case CPUID_MODEL_ICELAKE_L:
    //
    case CPUID_MODEL_COMETLAKE:
    case CPUID_MODEL_COMETLAKE_L:
    //
    case CPUID_MODEL_GRANITERAPIDS_X:
    case CPUID_MODEL_GRANITERAPIDS_D:
    //
    case CPUID_MODEL_ATOM_GOLDMONT:
    case CPUID_MODEL_ATOM_GOLDMONT_D:
    case CPUID_MODEL_ATOM_GOLDMONT_PLUS:
    case CPUID_MODEL_ATOM_TREMONT_D:
    case CPUID_MODEL_ATOM_TREMONT:
    case CPUID_MODEL_ATOM_TREMONT_L:
    //
    case CPUID_MODEL_ATOM_CRESTMONT_X:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_SAPPHIRERAPIDS_X:
    //
    case CPUID_MODEL_EMERALDRAPIDS_X:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = 0.000061;
      ctx->energy_units_psys = 1.0;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_SPR;
      break;
    //----
    case CPUID_MODEL_TIGERLAKE_L:
    case CPUID_MODEL_TIGERLAKE:
    //
    case CPUID_MODEL_ALDERLAKE:
    case CPUID_MODEL_ALDERLAKE_L:
    //
    case CPUID_MODEL_RAPTORLAKE:
    case CPUID_MODEL_RAPTORLAKE_P:
    case CPUID_MODEL_RAPTORLAKE_S:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT_PL4;
      break;
    //----
    case CPUID_MODEL_METEORLAKE_L:
    //
    case CPUID_MODEL_LUNARLAKE_M:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_METEORLAKE;
      break;
    //----
    case CPUID_MODEL_HASWELL_X:
    case CPUID_MODEL_BROADWELL_X:
    case CPUID_MODEL_BROADWELL_D:
    case CPUID_MODEL_SKYLAKE_X:
    case CPUID_MODEL_ICELAKE_X:
    case CPUID_MODEL_ICELAKE_D:
    case CPUID_MODEL_XEON_PHI_KNL:
    case CPUID_MODEL_XEON_PHI_KNM:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = 0.0000153;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_ATOM_SILVERMONT:
    case CPUID_MODEL_ATOM_SILVERMONT_MID:
    case CPUID_MODEL_ATOM_AIRMONT_MID:
    case CPUID_MODEL_ATOM_SOFIA:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      ctx->energy_units = from_msr_eu_atom(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_ATOM;
      break;
    case CPUID_MODEL_ATOM_SILVERMONT_D:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      // The Intel SDM claims we should use from_msr_eu_atom, but that appears to be incorrect
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_ATOM_AIRMONT:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_ATOM_AIRMONT;
      break;
    //----
    default:
      raplcap_log(ERROR, "Unknown architecture\n");
      raplcap_log(ERROR, "Please report a bug if you see this message, it should never occur!\n");
      assert(0);
      return;
  }
  raplcap_log(DEBUG, "msr_get_context: model=%02X, "
              "power_units=%.12f, energy_units=%.12f, energy_units_dram=%.12f, energy_units_psys=%.12f, "
              "time_units=%.12f\n",
              ctx->cpu_model, ctx->power_units, ctx->energy_units, ctx->energy_units_dram, ctx->energy_units_psys,
              ctx->time_units);
}